

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

bool __thiscall cashew::JSPrinter::endsInBlock(JSPrinter *this,Ref node)

{
  bool bVar1;
  Ref *pRVar2;
  Ref local_20;
  Ref node_local;
  
  local_20.inst = node.inst;
  if ((node.inst)->type == Array) {
    pRVar2 = Ref::operator[](&local_20,0);
    bVar1 = Ref::operator==(pRVar2,(IString *)BLOCK);
    if (bVar1) {
      return true;
    }
    if ((local_20.inst)->type == Array) {
      pRVar2 = Ref::operator[](&local_20,0);
      bVar1 = Ref::operator==(pRVar2,(IString *)LABEL);
      if (bVar1) {
        pRVar2 = Ref::operator[](&local_20,2);
        bVar1 = endsInBlock(this,pRVar2->inst);
        if (bVar1) {
          return true;
        }
      }
    }
  }
  if ((local_20.inst)->type == Array) {
    pRVar2 = Ref::operator[](&local_20,0);
    bVar1 = Ref::operator==(pRVar2,(IString *)IF);
    if (bVar1) {
      bVar1 = ifHasElse(local_20);
      pRVar2 = Ref::operator[](&local_20,bVar1 | 2);
      bVar1 = endsInBlock(this,pRVar2->inst);
      if (bVar1) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool endsInBlock(Ref node) {
    if (node->isArray() && node[0] == BLOCK) {
      return true;
    }
    // Check for a label on a block
    if (node->isArray() && node[0] == LABEL && endsInBlock(node[2])) {
      return true;
    }
    // Check for an if
    if (node->isArray() && node[0] == IF &&
        endsInBlock(ifHasElse(node) ? node[3] : node[2])) {
      return true;
    }
    return false;
  }